

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O2

void kmpc_get_poolstat(size_t *maxmem,size_t *allmem)

{
  kmp_info_t *th;
  kmp_info_t **ppkVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  ppkVar1 = __kmp_threads;
  iVar3 = __kmp_get_global_thread_id();
  th = ppkVar1[iVar3];
  __kmp_bget_dequeue(th);
  sVar4 = 0;
  sVar5 = 0;
  for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 1) {
    lVar8 = lVar7 * 0x30 + *(long *)(th->th_pad + 0x118);
    lVar9 = lVar8;
    lVar2 = lVar8;
    while (lVar10 = lVar2, lVar9 = *(long *)(lVar9 + 0x20), lVar9 != lVar8) {
      sVar5 = (sVar5 + *(long *)(lVar9 + 0x10)) - 0x20;
      lVar2 = lVar9;
      if ((lVar10 != lVar8) && (lVar2 = lVar10, *(long *)(lVar9 + 0x10) < *(long *)(lVar10 + 0x10)))
      {
        lVar2 = lVar9;
      }
    }
    if ((long)sVar4 <= (long)*(size_t *)(lVar10 + 0x10)) {
      sVar4 = *(size_t *)(lVar10 + 0x10);
    }
  }
  sVar6 = sVar4 - 0x20;
  if ((long)sVar4 < 0x21) {
    sVar6 = sVar4;
  }
  *maxmem = sVar6;
  *allmem = sVar5;
  return;
}

Assistant:

void
kmpc_get_poolstat( size_t *maxmem, size_t *allmem )
{
    kmp_info_t *th = __kmp_get_thread();
    bufsize a, b;

    __kmp_bget_dequeue( th );         /* Release any queued buffers */

    bcheck( th, &a, &b );

    *maxmem = a;
    *allmem = b;
}